

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf.c
# Opt level: O0

void alf_one_blk_fix(pel *dst,int i_dst,pel *src,int i_src,int lcu_width,int lcu_height,int *coef,
                    int sample_bit_depth)

{
  int iVar1;
  byte *pbVar2;
  pel *ppVar3;
  byte *pbVar4;
  int local_98;
  pel local_94;
  int local_90;
  int local_8c;
  pel local_88;
  int local_84;
  int local_80;
  pel local_7c;
  int local_78;
  int local_74;
  pel local_70;
  int local_6c;
  int max_pel;
  int sum;
  pel *p6;
  pel *p5;
  pel *p4;
  pel *p3;
  pel *p2;
  pel *p1;
  int lcu_height_local;
  int lcu_width_local;
  int i_src_local;
  pel *src_local;
  int i_dst_local;
  pel *dst_local;
  
  iVar1 = (1 << ((byte)sample_bit_depth & 0x1f)) + -1;
  if (*src != src[-1]) {
    pbVar2 = src + i_src;
    local_74 = (int)(coef[8] * (uint)*src +
                     coef[5] * ((uint)src[3] + (uint)src[-3]) +
                     coef[6] * ((uint)src[2] + (uint)src[-2]) +
                     coef[7] * ((uint)src[1] + (uint)src[-1]) +
                     coef[4] * ((uint)pbVar2[-1] + (uint)src[1]) +
                     coef[3] * ((uint)*pbVar2 + (uint)*src) +
                     coef[2] * ((uint)pbVar2[1] + (uint)*src) +
                     coef[1] * ((uint)src[i_src << 1] + (uint)*src) +
                     *coef * ((uint)src[i_src * 3] + (uint)*src) + 0x20) >> 6;
    local_6c = local_74;
    if (iVar1 < local_74) {
      local_6c = iVar1;
    }
    if (local_6c < 0) {
      local_70 = '\0';
    }
    else {
      if (iVar1 < local_74) {
        local_74 = iVar1;
      }
      local_70 = (pel)local_74;
    }
    *dst = local_70;
  }
  pbVar2 = src + (lcu_width + -1);
  ppVar3 = dst + (lcu_width + -1);
  if (*pbVar2 != pbVar2[1]) {
    pbVar4 = pbVar2 + i_src;
    local_80 = (int)(coef[8] * (uint)*pbVar2 +
                     coef[5] * ((uint)pbVar2[3] + (uint)pbVar2[-3]) +
                     coef[6] * ((uint)pbVar2[2] + (uint)pbVar2[-2]) +
                     coef[7] * ((uint)pbVar2[1] + (uint)pbVar2[-1]) +
                     coef[4] * ((uint)pbVar4[-1] + (uint)*pbVar2) +
                     coef[3] * ((uint)*pbVar4 + (uint)*pbVar2) +
                     coef[2] * ((uint)pbVar4[1] + (uint)pbVar2[-1]) +
                     coef[1] * ((uint)pbVar2[i_src << 1] + (uint)*pbVar2) +
                     *coef * ((uint)pbVar2[i_src * 3] + (uint)*pbVar2) + 0x20) >> 6;
    local_78 = local_80;
    if (iVar1 < local_80) {
      local_78 = iVar1;
    }
    if (local_78 < 0) {
      local_7c = '\0';
    }
    else {
      if (iVar1 < local_80) {
        local_80 = iVar1;
      }
      local_7c = (pel)local_80;
    }
    *ppVar3 = local_7c;
  }
  pbVar2 = pbVar2 + ((long)((lcu_height + -1) * i_src) - (long)(lcu_width + -1));
  if (*pbVar2 != pbVar2[-1]) {
    pbVar4 = pbVar2 + -(long)i_src;
    local_8c = (int)(coef[8] * (uint)*pbVar2 +
                     coef[5] * ((uint)pbVar2[3] + (uint)pbVar2[-3]) +
                     coef[6] * ((uint)pbVar2[2] + (uint)pbVar2[-2]) +
                     coef[7] * ((uint)pbVar2[1] + (uint)pbVar2[-1]) +
                     coef[4] * ((uint)*pbVar2 + (uint)pbVar4[1]) +
                     coef[3] * ((uint)*pbVar2 + (uint)*pbVar4) +
                     coef[2] * ((uint)pbVar2[1] + (uint)pbVar4[-1]) +
                     coef[1] * ((uint)*pbVar2 + (uint)pbVar2[-(long)(i_src << 1)]) +
                     *coef * ((uint)*pbVar2 + (uint)pbVar2[-(long)(i_src * 3)]) + 0x20) >> 6;
    local_84 = local_8c;
    if (iVar1 < local_8c) {
      local_84 = iVar1;
    }
    if (local_84 < 0) {
      local_88 = '\0';
    }
    else {
      if (iVar1 < local_8c) {
        local_8c = iVar1;
      }
      local_88 = (pel)local_8c;
    }
    ppVar3[(long)((lcu_height + -1) * i_dst) - (long)(lcu_width + -1)] = local_88;
  }
  pbVar2 = pbVar2 + (lcu_width + -1);
  if (*pbVar2 != pbVar2[1]) {
    pbVar4 = pbVar2 + -(long)i_src;
    local_98 = (int)(coef[8] * (uint)*pbVar2 +
                     coef[5] * ((uint)pbVar2[3] + (uint)pbVar2[-3]) +
                     coef[6] * ((uint)pbVar2[2] + (uint)pbVar2[-2]) +
                     coef[7] * ((uint)pbVar2[1] + (uint)pbVar2[-1]) +
                     coef[4] * ((uint)pbVar2[-1] + (uint)pbVar4[1]) +
                     coef[3] * ((uint)*pbVar2 + (uint)*pbVar4) +
                     coef[2] * ((uint)*pbVar2 + (uint)pbVar4[-1]) +
                     coef[1] * ((uint)*pbVar2 + (uint)pbVar2[-(long)(i_src << 1)]) +
                     *coef * ((uint)*pbVar2 + (uint)pbVar2[-(long)(i_src * 3)]) + 0x20) >> 6;
    local_90 = local_98;
    if (iVar1 < local_98) {
      local_90 = iVar1;
    }
    if (local_90 < 0) {
      local_94 = '\0';
    }
    else {
      if (iVar1 < local_98) {
        local_98 = iVar1;
      }
      local_94 = (pel)local_98;
    }
    (ppVar3 + ((long)((lcu_height + -1) * i_dst) - (long)(lcu_width + -1)))[lcu_width + -1] =
         local_94;
  }
  return;
}

Assistant:

static void alf_one_blk_fix(pel *dst, int i_dst, pel *src, int i_src,  int lcu_width, int lcu_height, int *coef, int sample_bit_depth)
{
    pel *p1, *p2, *p3, *p4, *p5, *p6;
    int sum;
    int max_pel = (1 << sample_bit_depth) - 1;

    if (src[0] != src[-1]) {
        p1 = src + 1 * i_src;
        p2 = src;
        p3 = src + 2 * i_src;
        p4 = src;
        p5 = src + 3 * i_src;
        p6 = src;

        sum  = coef[0] * (p5[ 0] + p6[ 0]);
        sum += coef[1] * (p3[ 0] + p4[ 0]);
        sum += coef[2] * (p1[ 1] + p2[ 0]);
        sum += coef[3] * (p1[ 0] + p2[ 0]);
        sum += coef[4] * (p1[-1] + p2[ 1]);
        sum += coef[7] * (src [ 1] + src [-1]);
        sum += coef[6] * (src [ 2] + src [-2]);
        sum += coef[5] * (src [ 3] + src [-3]);
        sum += coef[8] * (src [ 0]);

        sum = (int)((sum + 32) >> 6);
        dst[0] = COM_CLIP3(0, max_pel, sum);
    }

    src += lcu_width - 1;
    dst += lcu_width - 1;

    if (src[0] != src[1]) {
        p1 = src + 1 * i_src;
        p2 = src;
        p3 = src + 2 * i_src;
        p4 = src;
        p5 = src + 3 * i_src;
        p6 = src;

        sum  = coef[0] * (p5[ 0] + p6[ 0]);
        sum += coef[1] * (p3[ 0] + p4[ 0]);
        sum += coef[2] * (p1[ 1] + p2[-1]);
        sum += coef[3] * (p1[ 0] + p2[ 0]);
        sum += coef[4] * (p1[-1] + p2[ 0]);
        sum += coef[7] * (src [ 1] + src [-1]);
        sum += coef[6] * (src [ 2] + src [-2]);
        sum += coef[5] * (src [ 3] + src [-3]);
        sum += coef[8] * (src [ 0]);

        sum = (int)((sum + 32) >> 6);
        dst[0] = COM_CLIP3(0, max_pel, sum);
    }

    /* last line */
    src -= lcu_width - 1;
    dst -= lcu_width - 1;
    src += ((lcu_height - 1) * i_src);
    dst += ((lcu_height - 1) * i_dst);

    if (src[0] != src[-1]) {
        p1 = src;
        p2 = src - 1 * i_src;
        p3 = src;
        p4 = src - 2 * i_src;
        p5 = src;
        p6 = src - 3 * i_src;

        sum  = coef[0] * (p5[ 0] + p6[ 0]);
        sum += coef[1] * (p3[ 0] + p4[ 0]);
        sum += coef[2] * (p1[ 1] + p2[-1]);
        sum += coef[3] * (p1[ 0] + p2[ 0]);
        sum += coef[4] * (p1[ 0] + p2[ 1]);
        sum += coef[7] * (src [ 1] + src [-1]);
        sum += coef[6] * (src [ 2] + src [-2]);
        sum += coef[5] * (src [ 3] + src [-3]);
        sum += coef[8] * (src [ 0]);

        sum = (int)((sum + 32) >> 6);
        dst[0] = COM_CLIP3(0, max_pel, sum);
    }

    src += lcu_width - 1;
    dst += lcu_width - 1;

    if (src[0] != src[1]) {
        p1 = src;
        p2 = src - 1 * i_src;
        p3 = src;
        p4 = src - 2 * i_src;
        p5 = src;
        p6 = src - 3 * i_src;

        sum  = coef[0] * (p5[ 0] + p6[ 0]);
        sum += coef[1] * (p3[ 0] + p4[ 0]);
        sum += coef[2] * (p1[ 0] + p2[-1]);
        sum += coef[3] * (p1[ 0] + p2[ 0]);
        sum += coef[4] * (p1[-1] + p2[ 1]);
        sum += coef[7] * (src [ 1] + src [-1]);
        sum += coef[6] * (src [ 2] + src [-2]);
        sum += coef[5] * (src [ 3] + src [-3]);
        sum += coef[8] * (src [ 0]);

        sum = (int)((sum + 32) >> 6);
        dst[0] = COM_CLIP3(0, max_pel, sum);
    }
}